

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t archive_read_format_cab_bid(archive_read *a,wchar_t best_bid)

{
  bool bVar1;
  wchar_t wVar2;
  long *plVar3;
  void *pvVar4;
  wchar_t wVar5;
  ulong uVar6;
  char *pcVar7;
  char *p;
  long lVar8;
  ssize_t bytes_avail;
  long local_38;
  
  wVar2 = L'\xffffffff';
  if ((best_bid < L'A') &&
     (plVar3 = (long *)__archive_read_ahead(a,8,(ssize_t *)0x0), plVar3 != (long *)0x0)) {
    if (*plVar3 == 0x4643534d) {
      wVar2 = L'@';
    }
    else {
      wVar5 = L'\0';
      wVar2 = wVar5;
      if (((char)*plVar3 == 'M') && (wVar2 = L'\0', *(char *)((long)plVar3 + 1) == 'Z')) {
        uVar6 = 0x1000;
        lVar8 = 0;
        do {
          pvVar4 = __archive_read_ahead(a,lVar8 + uVar6,&local_38);
          if (pvVar4 == (void *)0x0) {
            uVar6 = (long)uVar6 >> 1;
            bVar1 = uVar6 < 0x80;
            if (uVar6 < 0x80) {
              wVar5 = L'\0';
            }
          }
          else {
            p = (char *)((long)pvVar4 + lVar8);
            pcVar7 = (char *)(local_38 + (long)pvVar4);
            do {
              if (pcVar7 <= p + 8) {
                lVar8 = (long)p - (long)pvVar4;
                bVar1 = false;
                goto LAB_0041f862;
              }
              wVar2 = find_cab_magic(p);
              p = p + (uint)wVar2;
            } while (wVar2 != L'\0');
            wVar5 = L'@';
            bVar1 = true;
          }
LAB_0041f862:
          if (bVar1) {
            return wVar5;
          }
        } while (lVar8 < 0x20000);
        wVar2 = L'\0';
      }
    }
  }
  return wVar2;
}

Assistant:

static int
archive_read_format_cab_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	ssize_t bytes_avail, offset, window;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 64)
		return (-1);

	if ((p = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);

	if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
		return (64);

	/*
	 * Attempt to handle self-extracting archives
	 * by noting a PE header and searching forward
	 * up to 128k for a 'MSCF' marker.
	 */
	if (p[0] == 'M' && p[1] == 'Z') {
		offset = 0;
		window = 4096;
		while (offset < (1024 * 128)) {
			const char *h = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 128)
					return (0);
				continue;
			}
			p = h + offset;
			while (p + 8 < h + bytes_avail) {
				int next;
				if ((next = find_cab_magic(p)) == 0)
					return (64);
				p += next;
			}
			offset = p - h;
		}
	}
	return (0);
}